

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

uint32_t dxil_spv::get_node_stride_from_annotate_handle(CallInst *inst)

{
  bool bVar1;
  Value *pVVar2;
  CallInst *this;
  ConstantAggregate *this_00;
  Constant *pCVar3;
  APInt *pAVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined4 local_28;
  uint32_t stride;
  uint32_t node_io_flags;
  ConstantAggregate *type_operand;
  CallInst *index_handle;
  CallInst *inst_local;
  
  pVVar2 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  bVar1 = value_is_dx_op_instrinsic(pVVar2,IndexNodeHandle);
  index_handle = inst;
  if (bVar1) {
    pVVar2 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    this = LLVMBC::cast<LLVMBC::CallInst>(pVVar2);
    pVVar2 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
    index_handle = LLVMBC::cast<LLVMBC::CallInst>(pVVar2);
  }
  pVVar2 = LLVMBC::Instruction::getOperand(&index_handle->super_Instruction,2);
  this_00 = LLVMBC::cast<LLVMBC::ConstantAggregate>(pVVar2);
  pCVar3 = LLVMBC::ConstantAggregate::getOperand(this_00,0);
  pCVar3 = &LLVMBC::cast<LLVMBC::ConstantInt>(&pCVar3->super_Value)->super_Constant;
  pAVar4 = LLVMBC::Constant::getUniqueInteger(pCVar3);
  uVar5 = LLVMBC::APInt::getZExtValue(pAVar4);
  pCVar3 = LLVMBC::ConstantAggregate::getOperand(this_00,1);
  pCVar3 = &LLVMBC::cast<LLVMBC::ConstantInt>(&pCVar3->super_Value)->super_Constant;
  pAVar4 = LLVMBC::Constant::getUniqueInteger(pCVar3);
  uVar6 = LLVMBC::APInt::getZExtValue(pAVar4);
  local_28 = (uint32_t)uVar6;
  if ((uVar5 & 0x100) != 0) {
    local_28 = (local_28 + 3 & 0xfffffffc) + 4;
  }
  return local_28;
}

Assistant:

static uint32_t get_node_stride_from_annotate_handle(const llvm::CallInst *inst)
{
	// This is a red herring, since the flags are wrong. Gotta keep digging ... >_<
	if (value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::IndexNodeHandle))
	{
		auto *index_handle = llvm::cast<llvm::CallInst>(inst->getOperand(1));
		inst = llvm::cast<llvm::CallInst>(index_handle->getOperand(1));
	}

	auto *type_operand = llvm::cast<llvm::ConstantAggregate>(inst->getOperand(2));
	uint32_t node_io_flags = llvm::cast<llvm::ConstantInt>(type_operand->getOperand(0))->getUniqueInteger().getZExtValue();
	uint32_t stride = llvm::cast<llvm::ConstantInt>(type_operand->getOperand(1))->getUniqueInteger().getZExtValue();

	if ((node_io_flags & DXIL::NodeIOTrackRWInputSharingBit) != 0)
	{
		stride = (stride + 3u) & ~3u;
		stride += 4;
	}

	return stride;
}